

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Window * sqlite3WindowDup(sqlite3 *db,Expr *pOwner,Window *p)

{
  char *pcVar1;
  Expr *pEVar2;
  ExprList *pEVar3;
  Window *local_28;
  Window *pNew;
  Window *p_local;
  Expr *pOwner_local;
  sqlite3 *db_local;
  
  local_28 = (Window *)0x0;
  if ((p != (Window *)0x0) &&
     (local_28 = (Window *)sqlite3DbMallocZero(db,0x70), local_28 != (Window *)0x0)) {
    pcVar1 = sqlite3DbStrDup(db,p->zName);
    local_28->zName = pcVar1;
    pEVar2 = sqlite3ExprDup(db,p->pFilter,0);
    local_28->pFilter = pEVar2;
    pEVar3 = sqlite3ExprListDup(db,p->pPartition,0);
    local_28->pPartition = pEVar3;
    pEVar3 = sqlite3ExprListDup(db,p->pOrderBy,0);
    local_28->pOrderBy = pEVar3;
    local_28->eType = p->eType;
    local_28->eEnd = p->eEnd;
    local_28->eStart = p->eStart;
    pEVar2 = sqlite3ExprDup(db,p->pStart,0);
    local_28->pStart = pEVar2;
    pEVar2 = sqlite3ExprDup(db,p->pEnd,0);
    local_28->pEnd = pEVar2;
    local_28->pOwner = pOwner;
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE Window *sqlite3WindowDup(sqlite3 *db, Expr *pOwner, Window *p){
  Window *pNew = 0;
  if( p ){
    pNew = sqlite3DbMallocZero(db, sizeof(Window));
    if( pNew ){
      pNew->zName = sqlite3DbStrDup(db, p->zName);
      pNew->pFilter = sqlite3ExprDup(db, p->pFilter, 0);
      pNew->pPartition = sqlite3ExprListDup(db, p->pPartition, 0);
      pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, 0);
      pNew->eType = p->eType;
      pNew->eEnd = p->eEnd;
      pNew->eStart = p->eStart;
      pNew->pStart = sqlite3ExprDup(db, p->pStart, 0);
      pNew->pEnd = sqlite3ExprDup(db, p->pEnd, 0);
      pNew->pOwner = pOwner;
    }
  }
  return pNew;
}